

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::internal::MatcherBase<const_phmap::priv::hash_internal::EnumClass_&>::~MatcherBase
          (MatcherBase<const_phmap::priv::hash_internal::EnumClass_&> *this)

{
  (this->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0021e6b8;
  Destroy(this);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }